

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotation_test_util.cc
# Opt level: O3

bool google::protobuf::compiler::annotation_test_util::DecodeMetadata
               (string *path,GeneratedCodeInfo *info)

{
  bool bVar1;
  Nonnull<const_char_*> failure_msg;
  string data;
  ArrayInputStream input;
  string local_58;
  ArrayInputStream local_38;
  
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  File::ReadFileToString((File *)&local_38,path,&local_58,false);
  if ((StatusRep *)local_38.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream == (StatusRep *)0x1)
  {
    io::ArrayInputStream::ArrayInputStream
              (&local_38,local_58._M_dataplus._M_p,(int)local_58._M_string_length,-1);
    bVar1 = MessageLite::ParseFromZeroCopyStream
                      ((MessageLite *)info,&local_38.super_ZeroCopyInputStream);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
    return bVar1;
  }
  failure_msg = absl::lts_20250127::status_internal::MakeCheckFailString
                          ((Nonnull<const_absl::Status_*>)&local_38,
                           "File::GetContents(path, &data, true) is OK");
  if (((ulong)local_38.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream & 1) == 0) {
    absl::lts_20250127::status_internal::StatusRep::Unref
              ((StatusRep *)local_38.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/annotation_test_util.cc"
             ,0x4c,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_38);
}

Assistant:

bool DecodeMetadata(const std::string& path, GeneratedCodeInfo* info) {
  std::string data;
  ABSL_CHECK_OK(File::GetContents(path, &data, true));
  io::ArrayInputStream input(data.data(), data.size());
  return info->ParseFromZeroCopyStream(&input);
}